

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void __thiscall
DCanvas::DrawLine(DCanvas *this,int x0,int y0,int x1,int y1,int palColor,uint32 realcolor)

{
  uint uVar1;
  BYTE *pBVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int xx;
  int iVar7;
  int xx_00;
  int iVar8;
  uint local_54;
  
  if (palColor < 0) {
    palColor = PalFromRGB(realcolor);
  }
  (*(this->super_DObject)._vptr_DObject[8])(this,1);
  iVar8 = y0;
  iVar7 = x1;
  xx = x0;
  if (y1 < y0) {
    iVar8 = y1;
    y1 = y0;
    iVar7 = x0;
    xx = x1;
  }
  PUTTRANSDOT(this,xx,iVar8,palColor,0);
  uVar4 = iVar7 - xx;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar5 = y1 - iVar8;
  if (uVar5 == 0) {
    if (x1 < x0) {
      x0 = x1;
    }
    memset(this->Buffer + (long)x0 + (long)iVar8 * (long)this->Pitch,palColor,(ulong)(uVar1 + 1));
  }
  else if (x0 == x1) {
    iVar7 = this->Pitch;
    pBVar2 = this->Buffer + (long)xx + (long)iVar8 * (long)iVar7;
    iVar8 = iVar8 - y1;
    do {
      *pBVar2 = (BYTE)palColor;
      pBVar2 = pBVar2 + iVar7;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
  }
  else {
    uVar6 = (int)uVar4 >> 0x1f | 1;
    if (uVar1 == uVar5) {
      iVar7 = this->Pitch;
      pBVar2 = this->Buffer + (long)xx + (long)(iVar8 * iVar7);
      do {
        *pBVar2 = (BYTE)palColor;
        pBVar2 = pBVar2 + (int)(uVar6 + iVar7);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    else {
      if ((int)uVar1 < (int)uVar5) {
        uVar3 = 0;
        uVar1 = (uVar1 << 0x10) / uVar5 & 0xffff;
        if ((int)uVar4 < 0) {
          uVar4 = 0;
          while (iVar8 = iVar8 + 1, y1 != iVar8) {
            uVar4 = uVar4 + uVar1;
            uVar5 = uVar4 >> 10 & 0x3f;
            PUTTRANSDOT(this,xx - (uVar4 >> 0x10),iVar8,palColor,uVar5);
            PUTTRANSDOT(this,~(uVar4 >> 0x10) + xx,iVar8,palColor,uVar5 ^ 0x3f);
          }
        }
        else {
          while (iVar8 = iVar8 + 1, y1 != iVar8) {
            uVar3 = uVar3 + uVar1;
            uVar4 = uVar3 >> 10 & 0x3f;
            xx_00 = (uVar3 >> 0x10) + xx;
            PUTTRANSDOT(this,xx_00,iVar8,palColor,uVar4);
            PUTTRANSDOT(this,xx_00 + uVar6,iVar8,palColor,uVar4 ^ 0x3f);
          }
        }
      }
      else {
        local_54 = 0;
        uVar3 = xx - iVar7;
        if (xx - iVar7 <= (int)uVar4) {
          uVar3 = uVar4;
        }
        while( true ) {
          xx = uVar6 + xx;
          if (uVar3 - 1 == 0) break;
          local_54 = local_54 + ((uVar5 * 0x10000) / uVar1 & 0xffff);
          uVar4 = local_54 >> 10 & 0x3f;
          PUTTRANSDOT(this,xx,iVar8 + (local_54 >> 0x10),palColor,uVar4);
          PUTTRANSDOT(this,xx,iVar8 + (local_54 >> 0x10) + 1,palColor,uVar4 ^ 0x3f);
          uVar3 = uVar3 - 1;
        }
      }
      PUTTRANSDOT(this,iVar7,y1,palColor,0);
    }
  }
  (*(this->super_DObject)._vptr_DObject[9])(this);
  return;
}

Assistant:

void DCanvas::DrawLine(int x0, int y0, int x1, int y1, int palColor, uint32 realcolor)
//void DrawTransWuLine (int x0, int y0, int x1, int y1, BYTE palColor)
{
	const int WeightingScale = 0;
	const int WEIGHTBITS = 6;
	const int WEIGHTSHIFT = 16-WEIGHTBITS;
	const int NUMWEIGHTS = (1<<WEIGHTBITS);
	const int WEIGHTMASK = (NUMWEIGHTS-1);

	if (palColor < 0)
	{
		palColor = PalFromRGB(realcolor);
	}

	Lock();
	int deltaX, deltaY, xDir;

	if (y0 > y1)
	{
		int temp = y0; y0 = y1; y1 = temp;
		temp = x0; x0 = x1; x1 = temp;
	}

	PUTTRANSDOT (x0, y0, palColor, 0);

	if ((deltaX = x1 - x0) >= 0)
	{
		xDir = 1;
	}
	else
	{
		xDir = -1;
		deltaX = -deltaX;
	}

	if ((deltaY = y1 - y0) == 0)
	{ // horizontal line
		if (x0 > x1)
		{
			swapvalues (x0, x1);
		}
		memset (GetBuffer() + y0*GetPitch() + x0, palColor, deltaX+1);
	}
	else if (deltaX == 0)
	{ // vertical line
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int pitch = GetPitch ();
		do
		{
			*spot = palColor;
			spot += pitch;
		} while (--deltaY != 0);
	}
	else if (deltaX == deltaY)
	{ // diagonal line.
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int advance = GetPitch() + xDir;
		do
		{
			*spot = palColor;
			spot += advance;
		} while (--deltaY != 0);
	}
	else
	{
		// line is not horizontal, diagonal, or vertical
		fixed_t errorAcc = 0;

		if (deltaY > deltaX)
		{ // y-major line
			fixed_t errorAdj = (((unsigned)deltaX << 16) / (unsigned)deltaY) & 0xffff;
			if (xDir < 0)
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
			else
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
		}
		else
		{ // x-major line
			fixed_t errorAdj = (((DWORD) deltaY << 16) / (DWORD) deltaX) & 0xffff;

			if (WeightingScale == 0)
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
			else
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
		}
		PUTTRANSDOT (x1, y1, palColor, 0);
	}
	Unlock();
}